

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O1

void __thiscall
ezy::detail::
range_view_slice<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>
::range_view_slice(range_view_slice<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>
                   *this,keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>
                         *orig,size_type f,size_type u)

{
  logic_error *this_00;
  
  (this->orig_range).t = orig->t;
  this->from = f;
  this->until = u;
  if (f <= u) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"logic error");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

constexpr range_view_slice(Keeper&& orig, size_type f, size_type u)
        : orig_range(std::move(orig))
        , from(f)
        , until(u)
      {
        if (from > until)
          throw std::logic_error("logic error"); // programming error
      }